

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adventurer.cpp
# Opt level: O3

void __thiscall despot::Adventurer::PrintPOMDPX(Adventurer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  long *plVar5;
  int a;
  int s;
  int iVar6;
  ulong uVar7;
  int s_3;
  long lVar8;
  int a_1;
  long lVar9;
  long lVar10;
  double dVar11;
  int s_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  actions;
  double local_88;
  long local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  long local_40;
  long local_38;
  
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"stay","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"left","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"right","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_58,
             &local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"<?xml version=\'1.0\' encoding=\'ISO-8859-1\'?>",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "<pomdpx version=\'1.0\' id=\'tagxmlfac\' xmlns:xsi=\'http://www.w3.org/2001/XMLSchema-instance\' xsi:noNamespaceSchemaLocation=\'pomdpx.xsd\'>"
             ,0x86);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Description>",0xd);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"description",0xb);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</Description>",0xe);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Discount>0.95</Discount>",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<Variable>",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
             ,0x4f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  for (iVar6 = 0; iVar3 = (**(code **)(*(long *)this + 0xf8))(), iVar6 < iVar3; iVar6 = iVar6 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," s",2);
    std::ostream::operator<<((ostream *)&std::cout,iVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," st </ValueEnum> </StateVar>",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  plVar5 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"<ObsVar vname=\"obs\"> <ValueEnum>",0x20);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < this->num_goals_) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," o",2);
      std::ostream::operator<<((ostream *)&std::cout,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->num_goals_);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ot",3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</ValueEnum>",0xc);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"</ObsVar>",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>",
             0x50);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"<RewardVar vname=\"reward\"/> </Variable>",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Parameter type = \"TBL\">",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < this->num_goals_) {
    iVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<Entry> <Instance> s",0x14);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->size_ * iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," </Instance> <ProbTable> ",0x19);
      poVar4 = std::ostream::_M_insert<double>(1.0 / (double)this->num_goals_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," </ProbTable> </Entry>",0x16);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->num_goals_);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"</Parameter> </CondProb> </InitialStateBelief>",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
             ,0x59);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Parameter type = \"TBL\">",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  for (local_80 = 0; iVar6 = (**(code **)(*(long *)this + 0xf8))(), local_80 < iVar6;
      local_80 = local_80 + 1) {
    local_40 = local_80 * 3;
    for (lVar10 = 0; iVar6 = (**(code **)(*(long *)this + 0x28))(), lVar10 < iVar6;
        lVar10 = lVar10 + 1) {
      lVar9 = *(long *)((long)&(((this->transition_probabilities_).
                                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                               )._M_impl.super__Vector_impl_data + local_40 * 8);
      lVar8 = *(long *)(lVar9 + lVar10 * 0x18);
      local_38 = lVar10;
      if (*(long *)(lVar9 + 8 + lVar10 * 0x18) == lVar8) {
        local_88 = 0.0;
      }
      else {
        local_88 = 0.0;
        lVar9 = 0x18;
        uVar7 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"<Entry> <Instance> ",0x13);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p,
                              local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)local_80);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
          poVar4 = (ostream *)
                   std::ostream::operator<<((ostream *)poVar4,*(int *)(lVar8 + -0xc + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," </Instance> <ProbTable> ",0x19);
          poVar4 = std::ostream::_M_insert<double>(*(double *)(lVar8 + lVar9));
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," </ProbTable> </Entry>",0x16);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          local_88 = local_88 + *(double *)(lVar8 + lVar9);
          uVar7 = uVar7 + 1;
          lVar2 = *(long *)((long)&(((this->transition_probabilities_).
                                     super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                                   )._M_impl.super__Vector_impl_data + local_40 * 8);
          lVar8 = *(long *)(lVar2 + lVar10 * 0x18);
          lVar9 = lVar9 + 0x20;
        } while (uVar7 < (ulong)(*(long *)(lVar2 + 8 + lVar10 * 0x18) - lVar8 >> 5));
      }
      lVar10 = local_38;
      if (1e-06 < ABS(local_88 + -1.0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"<Entry> <Instance> ",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_dataplus._M_p,
                            local_58.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar10]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," st </Instance> <ProbTable> ",0x1c);
        poVar4 = std::ostream::_M_insert<double>(1.0 - local_88);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," </ProbTable> </Entry>",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"</Parameter> </CondProb> </StateTransitionFunction>",0x33);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Parameter type = \"TBL\">",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  for (uVar7 = 0; iVar6 = (**(code **)(*(long *)this + 0x28))(), (long)uVar7 < (long)iVar6;
      uVar7 = uVar7 + 1) {
    for (lVar10 = 0; iVar6 = (**(code **)(*(long *)this + 0xf8))(), lVar10 < iVar6;
        lVar10 = lVar10 + 1) {
      if (0 < this->num_goals_) {
        lVar9 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"<Entry> <Instance> ",0x13);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,
                              local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p,
                              local_58.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," o",2);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(int)lVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," </Instance> <ProbTable> ",0x19);
          dVar11 = (double)(**(code **)(*(long *)this + 0x38))
                                     (this,lVar9,
                                      (this->states_).
                                      super__Vector_base<despot::AdventurerState_*,_std::allocator<despot::AdventurerState_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar10],
                                      uVar7 & 0xffffffff);
          poVar4 = std::ostream::_M_insert<double>(dVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," </ProbTable> </Entry>",0x16);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          lVar9 = lVar9 + 1;
        } while (lVar9 < this->num_goals_);
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>",0x4c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"</Parameter> </CondProb> </ObsFunction>",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>",0x4b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  poVar4 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"<Parameter type = \"TBL\">",0x18);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  for (uVar7 = 0; iVar6 = (**(code **)(*(long *)this + 0x28))(), (long)uVar7 < (long)iVar6;
      uVar7 = uVar7 + 1) {
    for (iVar6 = 0; iVar3 = (**(code **)(*(long *)this + 0xf8))(), iVar6 < iVar3; iVar6 = iVar6 + 1)
    {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<Entry> <Instance> ",0x13);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          local_58.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p,
                          local_58.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," s",2);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," </Instance> <ValueTable> ",0x1a);
      dVar11 = (double)(**(code **)(*(long *)this + 0x118))(this,iVar6,uVar7 & 0xffffffff);
      poVar4 = std::ostream::_M_insert<double>(dVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," </ValueTable> </Entry>",0x17);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>",0x49);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"</Parameter> </Func> </RewardFunction>",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"</pomdpx>",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
  std::ostream::put('P');
  std::ostream::flush();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void Adventurer::PrintPOMDPX() const {
	vector<string> actions;
	actions.push_back("stay");
	actions.push_back("left");
	actions.push_back("right");

	cout << "<?xml version='1.0' encoding='ISO-8859-1'?>" << endl
		<< "<pomdpx version='1.0' id='tagxmlfac' xmlns:xsi='http://www.w3.org/2001/XMLSchema-instance' xsi:noNamespaceSchemaLocation='pomdpx.xsd'>"
		<< endl << "<Description>" << endl << "description" << endl
		<< "</Description>" << endl << "<Discount>0.95</Discount>" << endl;

	cout << "<Variable>" << endl
		<< "<StateVar vnamePrev=\"state_0\" vnameCurr=\"state_1\" fullyObs=\"false\"> <ValueEnum>"
		<< endl;
	for (int s = 0; s < NumStates(); s++)
		cout << " s" << s;
	cout << " st </ValueEnum> </StateVar>" << endl << endl
		<< "<ObsVar vname=\"obs\"> <ValueEnum>" << endl;
	for (int g = 0; g < num_goals_; g++)
		cout << " o" << g;
	cout << " ot" << endl << "</ValueEnum>" << endl << "</ObsVar>" << endl
		<< "<ActionVar vname=\"action\"> <ValueEnum> stay left right </ValueEnum> </ActionVar>"
		<< endl << "<RewardVar vname=\"reward\"/> </Variable>" << endl;

	cout
		<< "<InitialStateBelief> <CondProb> <Var> state_0 </Var> <Parent> null </Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int goal = 0; goal < num_goals_; goal++) {
		cout << "<Entry> <Instance> s" << goal * size_
			<< " </Instance> <ProbTable> " << 1.0 / num_goals_
			<< " </ProbTable> </Entry>" << endl;
	}
	cout << "</Parameter> </CondProb> </InitialStateBelief>" << endl;

	cout
		<< "<StateTransitionFunction> <CondProb> <Var> state_1 </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int s = 0; s < NumStates(); s++) {
		for (int a = 0; a < NumActions(); a++) {
			double sum = 0;
			for (int i = 0; i < transition_probabilities_[s][a].size(); i++) {
				const State& next = transition_probabilities_[s][a][i];
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " s"
					<< next.state_id << " </Instance> <ProbTable> "
					<< next.weight << " </ProbTable> </Entry>" << endl;
				sum += next.weight;
			}

			if (fabs(sum - 1.0) > 0.000001)
				cout << "<Entry> <Instance> " << actions[a] << " s" << s
					<< " st </Instance> <ProbTable> " << (1 - sum)
					<< " </ProbTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st st </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </StateTransitionFunction>" << endl;

	cout
		<< "<ObsFunction> <CondProb> <Var> obs </Var> <Parent>action state_1</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			for (int o = 0; o < num_goals_; o++) {
				cout << "<Entry> <Instance> " << actions[a] << " s" << s << " o"
					<< o << " </Instance> <ProbTable> "
					<< ObsProb(o, *(states_[s]), a) << " </ProbTable> </Entry>"
					<< endl;
			}
		}
	}
	cout
		<< "<Entry> <Instance> * st ot </Instance> <ProbTable> 1.0 </ProbTable> </Entry>"
		<< endl;
	cout << "</Parameter> </CondProb> </ObsFunction>" << endl;

	cout
		<< "<RewardFunction> <Func> <Var> reward </Var> <Parent>action state_0</Parent>"
		<< endl << "<Parameter type = \"TBL\">" << endl;
	for (int a = 0; a < NumActions(); a++) {
		for (int s = 0; s < NumStates(); s++) {
			cout << "<Entry> <Instance> " << actions[a] << " s" << s
				<< " </Instance> <ValueTable> " << Reward(s, a)
				<< " </ValueTable> </Entry>" << endl;
		}
	}
	cout
		<< "<Entry> <Instance> * st </Instance> <ValueTable> 0 </ValueTable> </Entry>"
		<< endl;
	cout << "</Parameter> </Func> </RewardFunction>" << endl;
	cout << "</pomdpx>" << endl;
}